

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O0

Code * __thiscall md::Code::and_to_dx(Code *this,Param *from,DataRegister *to,Size size)

{
  short sVar1;
  uint16_t uVar2;
  int iVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  uint16_t local_28;
  short local_26;
  Size local_24;
  uint16_t opcode;
  uint16_t size_code;
  Size size_local;
  DataRegister *to_local;
  Param *from_local;
  Code *this_local;
  
  local_26 = 0;
  if (size == WORD) {
    local_26 = 1;
  }
  else if (size == LONG) {
    local_26 = 2;
  }
  local_24 = size;
  _opcode = to;
  to_local = (DataRegister *)from;
  from_local = (Param *)this;
  iVar3 = (**(to->super_Register).super_Param._vptr_Param)();
  sVar1 = local_26 * 0x40;
  uVar2 = Param::getMXn((Param *)to_local);
  local_28 = uVar2 + 0xc000 + (short)iVar3 * 0x200 + sVar1;
  add_opcode(this,local_28);
  (*(to_local->super_Register).super_Param._vptr_Param[2])();
  add_bytes(this,&local_40);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_40);
  return this;
}

Assistant:

Code& Code::and_to_dx(const Param& from, const DataRegister& to, Size size)
{
    uint16_t size_code = 0x0;
    if (size == Size::WORD)
        size_code = 0x1;
    else if (size == Size::LONG)
        size_code = 0x2;

    uint16_t opcode = 0xC000 + (to.getXn() << 9) + (size_code << 6) + from.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(from.getAdditionnalData());

    return *this;
}